

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall QSocks5SocketEnginePrivate::reauthenticate(QSocks5SocketEnginePrivate *this)

{
  QSocks5Authenticator *pQVar1;
  QTcpSocket *pQVar2;
  bool bVar3;
  quint16 qVar4;
  QSocks5PasswordAuthenticator *this_00;
  QSocks5SocketEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  QSocks5SocketEngine *q;
  QAuthenticator auth;
  QSignalBlocker blocker;
  undefined4 in_stack_fffffffffffffeb8;
  OpenModeFlag in_stack_fffffffffffffebc;
  QSocks5SocketEnginePrivate *in_stack_fffffffffffffec0;
  QNetworkProxy *in_stack_fffffffffffffec8;
  QObject *o;
  QAbstractSocketEngine *in_stack_fffffffffffffed0;
  byte local_fa;
  undefined4 local_cc;
  undefined1 local_c8 [8];
  QString *in_stack_ffffffffffffff40;
  Socks5State in_stack_ffffffffffffff4c;
  QSocks5SocketEnginePrivate *in_stack_ffffffffffffff50;
  QAuthenticator local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  local_20.d = (QAuthenticatorPrivate *)0xaaaaaaaaaaaaaaaa;
  QAuthenticator::QAuthenticator(&local_20);
  QAbstractSocketEngine::proxyAuthenticationRequired
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (QAuthenticator *)in_stack_fffffffffffffec0);
  QAuthenticator::user((QAuthenticator *)in_stack_fffffffffffffec8);
  bVar3 = QString::isEmpty((QString *)0x370681);
  local_fa = 1;
  if (bVar3) {
    QAuthenticator::password((QAuthenticator *)in_stack_fffffffffffffec8);
    bVar3 = QString::isEmpty((QString *)0x3706bc);
    local_fa = bVar3 ^ 0xff;
    QString::~QString((QString *)0x3706e0);
  }
  QString::~QString((QString *)0x3706ed);
  if ((local_fa & 1) == 0) {
    QString::QString((QString *)0x370925);
    setErrorState(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
    QString::~QString((QString *)0x370943);
    (**(code **)(*(long *)&in_RDI->data->controlSocket->super_QAbstractSocket + 0x70))();
    emitConnectionNotification(in_stack_fffffffffffffec0);
  }
  else {
    in_RDI->socks5State = Uninitialized;
    pQVar1 = in_RDI->data->authenticator;
    if (pQVar1 != (QSocks5Authenticator *)0x0) {
      (*pQVar1->_vptr_QSocks5Authenticator[1])();
    }
    in_stack_fffffffffffffec0 = (QSocks5SocketEnginePrivate *)&in_RDI->proxyInfo;
    QAuthenticator::user((QAuthenticator *)in_stack_fffffffffffffec8);
    QNetworkProxy::setUser
              ((QNetworkProxy *)in_stack_fffffffffffffec0,
               (QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QString::~QString((QString *)0x37076e);
    o = (QObject *)&in_RDI->proxyInfo;
    QAuthenticator::password((QAuthenticator *)o);
    QNetworkProxy::setPassword
              ((QNetworkProxy *)in_stack_fffffffffffffec0,
               (QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QString::~QString((QString *)0x3707b2);
    this_00 = (QSocks5PasswordAuthenticator *)operator_new(0x38);
    QNetworkProxy::user((QNetworkProxy *)o);
    QNetworkProxy::password((QNetworkProxy *)o);
    QSocks5PasswordAuthenticator::QSocks5PasswordAuthenticator
              (this_00,(QString *)o,(QString *)in_stack_fffffffffffffec0);
    in_RDI->data->authenticator = &this_00->super_QSocks5Authenticator;
    QString::~QString((QString *)0x37082f);
    QString::~QString((QString *)0x37083c);
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QSignalBlocker::QSignalBlocker((QSignalBlocker *)this_00,o);
    QAbstractSocket::abort(&in_RDI->data->controlSocket->super_QAbstractSocket);
    QSignalBlocker::~QSignalBlocker((QSignalBlocker *)in_stack_fffffffffffffec0);
    pQVar2 = in_RDI->data->controlSocket;
    QNetworkProxy::hostName((QNetworkProxy *)o);
    qVar4 = QNetworkProxy::port((QNetworkProxy *)in_stack_fffffffffffffec0);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffebc);
    (**(code **)(*(long *)&pQVar2->super_QAbstractSocket + 0xf8))(pQVar2,local_c8,qVar4,local_cc,2);
    QString::~QString((QString *)0x370919);
  }
  QAuthenticator::~QAuthenticator((QAuthenticator *)in_stack_fffffffffffffec0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::reauthenticate()
{
    Q_Q(QSocks5SocketEngine);

    // we require authentication
    QAuthenticator auth;
    q->proxyAuthenticationRequired(proxyInfo, &auth);

    if (!auth.user().isEmpty() || !auth.password().isEmpty()) {
        // we have new credentials, let's try again
        QSOCKS5_DEBUG << "authentication failure: retrying connection";
        socks5State = QSocks5SocketEnginePrivate::Uninitialized;

        delete data->authenticator;
        proxyInfo.setUser(auth.user());
        proxyInfo.setPassword(auth.password());
        data->authenticator = new QSocks5PasswordAuthenticator(proxyInfo.user(), proxyInfo.password());

        {
            const QSignalBlocker blocker(data->controlSocket);
            data->controlSocket->abort();
        }
        data->controlSocket->connectToHost(proxyInfo.hostName(), proxyInfo.port());
    } else {
        // authentication failure

        setErrorState(AuthenticatingError);
        data->controlSocket->close();
        emitConnectionNotification();
    }
}